

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O0

Cut_Cut_t * Cut_CutCreateTriv(Cut_Man_t *p,int Node)

{
  uint uVar1;
  Cut_Cut_t *p_00;
  uint *puVar2;
  int local_2c;
  int i;
  uint *pTruth;
  Cut_Cut_t *pCut;
  int Node_local;
  Cut_Man_t *p_local;
  
  pCut._4_4_ = Node;
  if (p->pParams->fSeq != 0) {
    pCut._4_4_ = Node << 8;
  }
  p_00 = Cut_CutAlloc(p);
  *(uint *)p_00 = *(uint *)p_00 & 0xfffffff | 0x10000000;
  *(int *)(p_00 + 1) = pCut._4_4_;
  uVar1 = Cut_NodeSign(pCut._4_4_);
  p_00->uSign = uVar1;
  if (p->pParams->fTruth != 0) {
    puVar2 = Cut_CutReadTruth(p_00);
    for (local_2c = 0; local_2c < p->nTruthWords; local_2c = local_2c + 1) {
      puVar2[local_2c] = 0xaaaaaaaa;
    }
  }
  p->nCutsTriv = p->nCutsTriv + 1;
  return p_00;
}

Assistant:

Cut_Cut_t * Cut_CutCreateTriv( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pCut;
    if ( p->pParams->fSeq )
        Node <<= CUT_SHIFT;
    pCut = Cut_CutAlloc( p );
    pCut->nLeaves    = 1;
    pCut->pLeaves[0] = Node;
    pCut->uSign      = Cut_NodeSign( Node );
    if ( p->pParams->fTruth )
    {
/*
        if ( pCut->nVarsMax == 4 )
            Cut_CutWriteTruth( pCut, p->uTruthVars[0] );
        else
            Extra_BitCopy( pCut->nLeaves, p->uTruths[0], (uint8*)Cut_CutReadTruth(pCut) );
*/
        unsigned * pTruth = Cut_CutReadTruth(pCut);
        int i;
        for ( i = 0; i < p->nTruthWords; i++ )
            pTruth[i] = 0xAAAAAAAA;
    }
    p->nCutsTriv++;
    return pCut;
}